

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

var cs::make_cni<cs_impl::any(&)(std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>&)>
              (_func_any__Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_ptr>_ptr *func,
              types type)

{
  proxy *in_RDI;
  proxy *this;
  types *in_stack_ffffffffffffffd0;
  cni *in_stack_ffffffffffffffd8;
  
  this = in_RDI;
  cs_impl::cni::
  cni<cs_impl::any(&)(std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>&)>
            ((cni *)in_RDI,
             (_func_any__Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_ptr>_ptr *)in_RDI
            );
  cs_impl::any::make_protect<cs::callable,cs_impl::cni,cs::callable::types&>
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  cs_impl::cni::~cni((cni *)this);
  return (var)in_RDI;
}

Assistant:

var make_cni(T &&func, callable::types type)
	{
		return var::make_protect<callable>(cni(func), type);
	}